

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals,
               BackwardReferenceFromDecoder *backward_references,size_t *back_refs_position,
               size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  size_t sVar12;
  long lVar13;
  uint8_t *puVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  short sVar23;
  uint8_t uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  bool bVar43;
  ulong local_170;
  ulong local_160;
  ulong local_148;
  ulong local_140;
  ulong local_110;
  size_t *local_f8;
  int local_e4;
  ulong local_e0;
  int local_d8;
  ulong local_b0;
  ulong auStack_58 [5];
  
  uVar8 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar12 = position;
  if (7 < num_bytes) {
    sVar12 = uVar3;
  }
  lVar13 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar13 = 0x40;
  }
  uVar1 = position + num_bytes;
  lVar2 = position - 1;
  lVar4 = *(long *)(literal_context_lut + 0x10);
  uVar33 = *(ulong *)dist_cache;
  uVar10 = lVar13 + position;
  uVar6 = (uint)ringbuffer_mask;
  local_f8 = last_insert_len;
LAB_001104ee:
LAB_001104fc:
  uVar27 = position;
  if (uVar1 <= uVar27 + 8) {
    *(ulong *)dist_cache = (uVar33 + uVar1) - uVar27;
    *(long *)commands = *(long *)commands + ((long)local_f8 - (long)last_insert_len >> 4);
    return;
  }
  local_140 = uVar1 - uVar27;
  uVar32 = uVar8;
  if (uVar27 < uVar8) {
    uVar32 = uVar27;
  }
  uVar15 = lVar4 + uVar27;
  if (uVar8 <= lVar4 + uVar27) {
    uVar15 = uVar8;
  }
  uVar28 = uVar27 & ringbuffer_mask;
  uVar24 = ringbuffer[uVar28];
  local_160 = (ulong)*(int *)&(hasher->common).extra;
  uVar37 = 0x7e4;
  if ((uVar27 - local_160 < uVar27) &&
     (uVar30 = (ulong)((uint)(uVar27 - local_160) & uVar6), uVar24 == ringbuffer[uVar30])) {
    uVar22 = local_140 & 0xfffffffffffffff8;
    uVar40 = 0;
    lVar18 = 0;
LAB_00110592:
    if (local_140 >> 3 == uVar40) {
      uVar19 = (ulong)((uint)local_140 & 7);
      for (; (bVar43 = uVar19 != 0, uVar19 = uVar19 - 1, uVar40 = local_140, bVar43 &&
             (uVar40 = uVar22, ringbuffer[uVar22 + uVar30] == ringbuffer[uVar22 + uVar28]));
          uVar22 = uVar22 + 1) {
      }
    }
    else {
      if (*(ulong *)(ringbuffer + uVar40 * 8 + uVar28) ==
          *(ulong *)(ringbuffer + uVar40 * 8 + uVar30)) goto code_r0x001105a8;
      uVar22 = *(ulong *)(ringbuffer + uVar40 * 8 + uVar30) ^
               *(ulong *)(ringbuffer + uVar40 * 8 + uVar28);
      uVar30 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar40 = (uVar30 >> 3 & 0x1fffffff) - lVar18;
    }
    if ((uVar40 < 4) || (uVar30 = uVar40 * 0x87 + 0x78f, uVar30 < 0x7e5)) goto LAB_001105ee;
    uVar24 = ringbuffer[uVar40 + uVar28];
    uVar37 = uVar30;
  }
  else {
LAB_001105ee:
    local_160 = 0;
    uVar40 = 0;
  }
  uVar30 = *(ulong *)(literal_context_lut + 0x50);
  lVar18 = *(long *)&(params->hasher).num_last_distances_to_check;
  lVar42 = *(long *)(ringbuffer + uVar28);
  for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 8) {
    *(ulong *)((long)auStack_58 + lVar31) =
         (ulong)((uint)((ulong)(lVar42 * -0x42e1ca5843000000) >> 0x2f) + (int)lVar31 & 0x1ffff);
  }
  uVar17 = (uint)uVar27;
  lVar31 = *(long *)((long)auStack_58 + (ulong)(uVar17 & 0x18));
  for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
    uVar35 = *(uint *)(lVar18 + auStack_58[lVar41] * 4);
    uVar34 = uVar6 & uVar35;
    if (((uVar24 == ringbuffer[uVar40 + uVar34]) && (uVar27 != uVar35)) &&
       (uVar22 = uVar27 - uVar35, uVar22 <= uVar32)) {
      uVar19 = 0;
      lVar25 = 0;
LAB_001106cd:
      uVar9 = local_140 & 0xfffffffffffffff8;
      uVar26 = (ulong)((uint)local_140 & 7);
      if (local_140 >> 3 == uVar19) {
        for (; (uVar19 = local_140, uVar26 != 0 &&
               (uVar19 = uVar9, ringbuffer[uVar9 + uVar34] == ringbuffer[uVar9 + uVar28]));
            uVar9 = uVar9 + 1) {
          uVar26 = uVar26 - 1;
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar19 * 8 + uVar28) ==
            *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar34)) goto code_r0x001106e0;
        uVar9 = *(ulong *)(ringbuffer + uVar19 * 8 + (ulong)uVar34) ^
                *(ulong *)(ringbuffer + uVar19 * 8 + uVar28);
        uVar19 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        uVar19 = (uVar19 >> 3 & 0x1fffffff) - lVar25;
      }
      if (3 < uVar19) {
        iVar39 = 0x1f;
        if ((uint)uVar22 != 0) {
          for (; (uint)uVar22 >> iVar39 == 0; iVar39 = iVar39 + -1) {
          }
        }
        uVar9 = (ulong)(iVar39 * -0x1e + 0x780) + uVar19 * 0x87;
        if (uVar37 < uVar9) {
          uVar24 = ringbuffer[uVar19 + uVar28];
          uVar40 = uVar19;
          uVar37 = uVar9;
          local_160 = uVar22;
        }
      }
    }
  }
  if (uVar37 == 0x7e4) {
    lVar41 = *(long *)&(params->hasher).block_bits;
    uVar32 = *(ulong *)(lVar41 + 8);
    local_110 = *(ulong *)(lVar41 + 0x10);
    if (uVar32 >> 7 <= local_110) {
      local_148._0_4_ = (int)lVar42;
      uVar22 = (ulong)((uint)((int)local_148 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      bVar43 = true;
      uVar37 = 0x7e4;
      iVar39 = 0;
      while (bVar43) {
        uVar32 = uVar32 + 1;
        *(ulong *)(lVar41 + 8) = uVar32;
        bVar11 = *(byte *)(*(long *)(literal_context_lut + 0x78) + uVar22);
        uVar19 = (ulong)bVar11;
        if ((uVar19 != 0) && (uVar19 <= local_140)) {
          uVar9 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar22 * 2);
          lVar42 = *(long *)(literal_context_lut + 0x58);
          lVar25 = uVar9 * uVar19 + *(long *)(lVar42 + 0xa8) +
                   (ulong)*(uint *)(lVar42 + 0x20 + uVar19 * 4);
          uVar26 = (ulong)(bVar11 & 0xfffffff8);
          uVar36 = 0;
LAB_0011086c:
          if (uVar26 == uVar36) {
            uVar38 = (ulong)(bVar11 & 7);
            puVar14 = (uint8_t *)(lVar25 + uVar36);
            for (; (bVar43 = uVar38 != 0, uVar38 = uVar38 - 1, uVar36 = uVar19, bVar43 &&
                   (uVar36 = uVar26, ringbuffer[uVar26 + uVar28] == *puVar14)); uVar26 = uVar26 + 1)
            {
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar38 = *(ulong *)(lVar25 + uVar36);
            if (uVar38 == *(ulong *)(ringbuffer + uVar36 + uVar28)) goto code_r0x00110882;
            uVar38 = *(ulong *)(ringbuffer + uVar36 + uVar28) ^ uVar38;
            uVar26 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar36 = (uVar26 >> 3 & 0x1fffffff) + uVar36;
          }
          if (((uVar36 != 0) && (uVar19 < *(uint *)(literal_context_lut + 100) + uVar36)) &&
             (uVar19 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                      ((char)(uVar19 - uVar36) * '\x06' & 0x3fU)) & 0x3f) +
                        (uVar19 - uVar36) * 4 << (*(byte *)(lVar42 + uVar19) & 0x3f)) +
                       uVar9 + uVar15 + 1, uVar19 <= uVar30)) {
            iVar29 = 0x1f;
            if ((uint)uVar19 != 0) {
              for (; (uint)uVar19 >> iVar29 == 0; iVar29 = iVar29 + -1) {
              }
            }
            uVar9 = (uVar36 * 0x87 - (ulong)(uint)(iVar29 * 0x1e)) + 0x780;
            if (uVar37 <= uVar9) {
              iVar39 = (uint)bVar11 - (int)uVar36;
              local_110 = local_110 + 1;
              *(ulong *)(lVar41 + 0x10) = local_110;
              uVar37 = uVar9;
              uVar40 = uVar36;
              local_160 = uVar19;
            }
          }
        }
        uVar22 = uVar22 + 1;
        bVar43 = false;
      }
      goto LAB_001109b1;
    }
    *(uint *)(lVar18 + lVar31 * 4) = uVar17;
  }
  else {
    iVar39 = 0;
LAB_001109b1:
    *(uint *)(lVar18 + lVar31 * 4) = uVar17;
    if (0x7e4 < uVar37) goto LAB_00110ab8;
  }
  uVar33 = uVar33 + 1;
  position = uVar27 + 1;
  if ((num_literals == (size_t *)0x0) && (uVar10 < position)) {
    if (uVar10 + (uint)((int)lVar13 * 4) < position) {
      uVar32 = uVar27 + 0x11;
      if (uVar3 <= uVar27 + 0x11) {
        uVar32 = uVar3;
      }
      for (; position < uVar32; position = position + 4) {
        *(uint *)(lVar18 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x42e1ca5843000000) >> 0x2f) +
                                   ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        uVar33 = uVar33 + 4;
      }
    }
    else {
      uVar32 = uVar27 + 9;
      if (uVar3 <= uVar27 + 9) {
        uVar32 = uVar3;
      }
      for (; position < uVar32; position = position + 2) {
        *(uint *)(lVar18 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                           (position & ringbuffer_mask)) *
                                                 -0x42e1ca5843000000) >> 0x2f) +
                                   ((uint)position & 0x18) & 0x1ffff) * 4) = (uint)position;
        uVar33 = uVar33 + 2;
      }
    }
  }
  goto LAB_001104fc;
code_r0x001105a8:
  lVar18 = lVar18 + -8;
  uVar40 = uVar40 + 1;
  goto LAB_00110592;
code_r0x001106e0:
  lVar25 = lVar25 + -8;
  uVar19 = uVar19 + 1;
  goto LAB_001106cd;
code_r0x00110882:
  uVar36 = uVar36 + 8;
  goto LAB_0011086c;
LAB_00110ab8:
  uVar32 = (ulong)*(int *)&(hasher->common).extra;
  uVar10 = uVar33 + 4;
  uVar15 = (lVar2 + num_bytes) - uVar27;
  local_e4 = 0;
  do {
    uVar22 = (ulong)((uint)uVar15 & 7);
    local_140 = local_140 - 1;
    uVar28 = uVar40 - 1;
    if (local_140 <= uVar40 - 1) {
      uVar28 = local_140;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar28 = 0;
    }
    uVar19 = uVar27 + 1;
    uVar9 = uVar8;
    if (uVar19 < uVar8) {
      uVar9 = uVar19;
    }
    local_e0 = lVar4 + uVar27 + 1;
    if (uVar8 <= local_e0) {
      local_e0 = uVar8;
    }
    uVar38 = uVar19 & ringbuffer_mask;
    uVar24 = ringbuffer[uVar28 + uVar38];
    uVar36 = uVar19 - uVar32;
    uVar26 = 0x7e4;
    if ((uVar36 < uVar19) && (uVar17 = (uint)uVar36 & uVar6, uVar24 == ringbuffer[uVar28 + uVar17]))
    {
      uVar36 = 0;
      lVar42 = 0;
LAB_00110ba3:
      if (uVar15 >> 3 == uVar36) {
        uVar36 = uVar22;
        for (local_148 = -lVar42;
            (bVar43 = uVar36 != 0, uVar36 = uVar36 - 1, bVar43 &&
            (ringbuffer[local_148 + uVar17] == ringbuffer[local_148 + uVar38]));
            local_148 = local_148 + 1) {
        }
      }
      else {
        if (*(ulong *)(ringbuffer + uVar36 * 8 + uVar38) ==
            *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar17)) goto code_r0x00110bbe;
        uVar20 = *(ulong *)(ringbuffer + uVar36 * 8 + (ulong)uVar17) ^
                 *(ulong *)(ringbuffer + uVar36 * 8 + uVar38);
        uVar36 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
          }
        }
        local_148 = (uVar36 >> 3 & 0x1fffffff) - lVar42;
      }
      if ((local_148 < 4) || (uVar36 = local_148 * 0x87 + 0x78f, uVar36 < 0x7e5)) goto LAB_00110c21;
      uVar24 = ringbuffer[local_148 + uVar38];
      uVar28 = local_148;
      uVar26 = uVar36;
      local_170 = uVar32;
    }
    else {
LAB_00110c21:
      local_170 = 0;
      local_148 = 0;
    }
    lVar42 = *(long *)(ringbuffer + uVar38);
    for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 8) {
      *(ulong *)((long)auStack_58 + lVar31) =
           (ulong)((uint)((ulong)(lVar42 * -0x42e1ca5843000000) >> 0x2f) + (int)lVar31 & 0x1ffff);
    }
    lVar31 = *(long *)((long)auStack_58 + (ulong)((uint)uVar19 & 0x18));
    for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
      uVar17 = *(uint *)(lVar18 + auStack_58[lVar41] * 4);
      uVar35 = uVar6 & uVar17;
      if (((uVar24 == ringbuffer[uVar28 + uVar35]) && (uVar19 != uVar17)) &&
         (uVar36 = uVar19 - uVar17, uVar36 <= uVar9)) {
        uVar20 = 0;
        lVar25 = 0;
LAB_00110cd0:
        if (uVar15 >> 3 == uVar20) {
          uVar16 = uVar22;
          for (uVar20 = -lVar25;
              (bVar43 = uVar16 != 0, uVar16 = uVar16 - 1, bVar43 &&
              (ringbuffer[uVar20 + uVar35] == ringbuffer[uVar20 + uVar38])); uVar20 = uVar20 + 1) {
          }
        }
        else {
          if (*(ulong *)(ringbuffer + uVar20 * 8 + uVar38) ==
              *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar35)) goto code_r0x00110ce8;
          uVar16 = *(ulong *)(ringbuffer + uVar20 * 8 + (ulong)uVar35) ^
                   *(ulong *)(ringbuffer + uVar20 * 8 + uVar38);
          uVar20 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
            }
          }
          uVar20 = (uVar20 >> 3 & 0x1fffffff) - lVar25;
        }
        if (3 < uVar20) {
          iVar29 = 0x1f;
          if ((uint)uVar36 != 0) {
            for (; (uint)uVar36 >> iVar29 == 0; iVar29 = iVar29 + -1) {
            }
          }
          uVar16 = (ulong)(iVar29 * -0x1e + 0x780) + uVar20 * 0x87;
          if (uVar26 < uVar16) {
            uVar24 = ringbuffer[uVar20 + uVar38];
            uVar28 = uVar20;
            uVar26 = uVar16;
            local_170 = uVar36;
            local_148 = uVar20;
          }
        }
      }
    }
    iVar29 = 0;
    if (uVar26 == 0x7e4) {
      lVar41 = *(long *)&(params->hasher).block_bits;
      uVar28 = *(ulong *)(lVar41 + 8);
      local_b0 = *(ulong *)(lVar41 + 0x10);
      uVar26 = 0x7e4;
      if (uVar28 >> 7 <= local_b0) {
        local_d8 = (int)lVar42;
        uVar22 = (ulong)((uint)(local_d8 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        bVar43 = true;
        iVar29 = 0;
        while (bVar43) {
          uVar28 = uVar28 + 1;
          *(ulong *)(lVar41 + 8) = uVar28;
          bVar11 = *(byte *)(*(long *)(literal_context_lut + 0x78) + uVar22);
          uVar9 = (ulong)bVar11;
          if ((uVar9 != 0) && (uVar9 <= local_140)) {
            uVar16 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar22 * 2);
            lVar42 = *(long *)(literal_context_lut + 0x58);
            lVar25 = uVar16 * uVar9 + *(long *)(lVar42 + 0xa8) +
                     (ulong)*(uint *)(lVar42 + 0x20 + uVar9 * 4);
            uVar36 = (ulong)(bVar11 & 0xfffffff8);
            uVar20 = 0;
LAB_00110e79:
            if (uVar36 == uVar20) {
              uVar21 = (ulong)(bVar11 & 7);
              puVar14 = (uint8_t *)(lVar25 + uVar20);
              for (; (bVar43 = uVar21 != 0, uVar21 = uVar21 - 1, uVar20 = uVar9, bVar43 &&
                     (uVar20 = uVar36, ringbuffer[uVar36 + uVar38] == *puVar14));
                  uVar36 = uVar36 + 1) {
                puVar14 = puVar14 + 1;
              }
            }
            else {
              uVar21 = *(ulong *)(lVar25 + uVar20);
              if (uVar21 == *(ulong *)(ringbuffer + uVar20 + uVar38)) goto code_r0x00110e94;
              uVar21 = *(ulong *)(ringbuffer + uVar20 + uVar38) ^ uVar21;
              uVar36 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar20 = (uVar36 >> 3 & 0x1fffffff) + uVar20;
            }
            if (((uVar20 != 0) && (uVar9 < *(uint *)(literal_context_lut + 100) + uVar20)) &&
               (uVar9 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                                       ((char)(uVar9 - uVar20) * '\x06' & 0x3fU)) & 0x3f) +
                         (uVar9 - uVar20) * 4 << (*(byte *)(lVar42 + uVar9) & 0x3f)) +
                        uVar16 + local_e0 + 1, uVar9 <= uVar30)) {
              iVar5 = 0x1f;
              if ((uint)uVar9 != 0) {
                for (; (uint)uVar9 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              uVar36 = (uVar20 * 0x87 - (ulong)(uint)(iVar5 * 0x1e)) + 0x780;
              if (uVar26 <= uVar36) {
                iVar29 = (uint)bVar11 - (int)uVar20;
                local_b0 = local_b0 + 1;
                *(ulong *)(lVar41 + 0x10) = local_b0;
                uVar26 = uVar36;
                local_148 = uVar20;
                local_170 = uVar9;
              }
            }
          }
          uVar22 = uVar22 + 1;
          bVar43 = false;
        }
      }
    }
    *(uint *)(lVar18 + lVar31 * 4) = (uint)uVar19;
    if (uVar26 < uVar37 + 0xaf) {
      uVar19 = uVar27;
      uVar28 = uVar33;
      local_148 = uVar40;
      iVar29 = iVar39;
      local_e0 = uVar27 + lVar4;
      if (uVar8 <= uVar27 + lVar4) {
        local_e0 = uVar8;
      }
      break;
    }
    uVar28 = uVar10;
    local_160 = local_170;
    if (local_e4 == 3) break;
    uVar33 = uVar33 + 1;
    local_e4 = local_e4 + 1;
    uVar22 = uVar27 + 9;
    uVar15 = uVar15 - 1;
    uVar40 = local_148;
    uVar27 = uVar19;
    uVar28 = uVar33;
    uVar37 = uVar26;
    iVar39 = iVar29;
  } while (uVar22 < uVar1);
  if (local_e0 < local_160) {
LAB_00111096:
    uVar33 = local_160 + 0xf;
  }
  else {
    uVar10 = (ulong)*(int *)&(hasher->common).extra;
    if (local_160 == uVar10) {
      uVar33 = 0;
      goto LAB_001110d7;
    }
    uVar27 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
    uVar33 = 1;
    if (local_160 != uVar27) {
      uVar10 = (local_160 + 3) - uVar10;
      if (uVar10 < 7) {
        bVar11 = (byte)((int)uVar10 << 2);
        uVar17 = 0x9750468;
      }
      else {
        uVar27 = (local_160 + 3) - uVar27;
        if (6 < uVar27) {
          uVar33 = 2;
          if ((local_160 != (long)(int)(hasher->common).dict_num_lookups) &&
             (uVar33 = 3, local_160 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4))
             ) goto LAB_00111096;
          goto LAB_0011109a;
        }
        bVar11 = (byte)((int)uVar27 << 2);
        uVar17 = 0xfdb1ace;
      }
      uVar33 = (ulong)(uVar17 >> (bVar11 & 0x1f) & 0xf);
    }
  }
LAB_0011109a:
  if ((local_160 <= local_e0) && (uVar33 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_160;
  }
LAB_001110d7:
  uVar17 = (uint)uVar28;
  *(uint *)local_f8 = uVar17;
  *(uint *)((long)local_f8 + 4) = iVar29 << 0x19 | (uint)local_148;
  uVar10 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  uVar35 = 0;
  if (uVar10 <= uVar33) {
    bVar11 = (byte)*(uint *)(literal_context_lut + 0x40);
    uVar27 = ((uVar33 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar11 & 0x3f))) - 0x10;
    uVar35 = 0x1f;
    uVar34 = (uint)uVar27;
    if (uVar34 != 0) {
      for (; uVar34 >> uVar35 == 0; uVar35 = uVar35 - 1) {
      }
    }
    uVar35 = (uVar35 ^ 0xffffffe0) + 0x1f;
    uVar32 = (ulong)((uVar27 >> ((ulong)uVar35 & 0x3f) & 1) != 0);
    lVar42 = (ulong)uVar35 - (ulong)*(uint *)(literal_context_lut + 0x40);
    uVar33 = (~(-1 << (bVar11 & 0x1f)) & uVar34) + uVar10 +
             (uVar32 + lVar42 * 2 + 0xfffe << (bVar11 & 0x3f)) | lVar42 * 0x400;
    uVar35 = (uint)(uVar27 - (uVar32 + 2 << ((byte)uVar35 & 0x3f)) >> (bVar11 & 0x3f));
  }
  *(short *)((long)local_f8 + 0xe) = (short)uVar33;
  *(uint *)(local_f8 + 1) = uVar35;
  if (5 < uVar28) {
    if (uVar28 < 0x82) {
      uVar17 = 0x1f;
      uVar35 = (uint)(uVar28 - 2);
      if (uVar35 != 0) {
        for (; uVar35 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (int)(uVar28 - 2 >> ((char)(uVar17 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar17 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar28 < 0x842) {
      uVar35 = 0x1f;
      if (uVar17 - 0x42 != 0) {
        for (; uVar17 - 0x42 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar17 = (uVar35 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar17 = 0x15;
      if (0x1841 < uVar28) {
        uVar17 = (uint)(ushort)(0x17 - (uVar28 < 0x5842));
      }
    }
  }
  uVar35 = iVar29 + (uint)local_148;
  if (uVar35 < 10) {
    uVar10 = (ulong)(uVar35 - 2);
  }
  else if (uVar35 < 0x86) {
    uVar35 = uVar35 - 6;
    uVar34 = 0x1f;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar34 == 0; uVar34 = uVar34 - 1) {
      }
    }
    uVar10 = (ulong)((uVar35 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                     (uVar34 ^ 0xffffffe0) * 2 + 0x42);
  }
  else {
    uVar10 = 0x17;
    if (uVar35 < 0x846) {
      uVar34 = 0x1f;
      if (uVar35 - 0x46 != 0) {
        for (; uVar35 - 0x46 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar10 = (ulong)((uVar34 ^ 0xffe0) + 0x2c);
    }
  }
  uVar7 = (ushort)uVar10;
  sVar23 = (uVar7 & 7) + ((ushort)uVar17 & 7) * 8;
  if ((((uVar33 & 0x3ff) == 0) && ((ushort)uVar17 < 8)) && (uVar7 < 0x10)) {
    if (7 < uVar7) {
      sVar23 = sVar23 + 0x40;
    }
  }
  else {
    iVar39 = ((uVar17 & 0xffff) >> 3) * 3 + (int)((uVar10 & 0xffff) >> 3);
    sVar23 = sVar23 + ((ushort)(0x520d40 >> ((char)iVar39 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar39 * 0x40 + 0x40;
  }
  *(short *)((long)local_f8 + 0xc) = sVar23;
  *num_commands = *num_commands + uVar28;
  position = local_148 + uVar19;
  uVar33 = sVar12;
  if (position < sVar12) {
    uVar33 = position;
  }
  uVar27 = uVar19 + 2;
  if (local_160 < local_148 >> 2) {
    uVar10 = position + local_160 * -4;
    if (uVar10 < uVar27) {
      uVar10 = uVar27;
    }
    uVar27 = uVar10;
    if (uVar33 < uVar10) {
      uVar27 = uVar33;
    }
  }
  uVar10 = local_148 * 2 + uVar19 + lVar13;
  local_f8 = local_f8 + 2;
  for (; uVar27 < uVar33; uVar27 = uVar27 + 1) {
    *(uint *)(lVar18 + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar27 & ringbuffer_mask)) *
                                             -0x42e1ca5843000000) >> 0x2f) + ((uint)uVar27 & 0x18) &
                              0x1ffff) * 4) = (uint)uVar27;
  }
  uVar33 = 0;
  goto LAB_001104ee;
code_r0x00110bbe:
  lVar42 = lVar42 + -8;
  uVar36 = uVar36 + 1;
  goto LAB_00110ba3;
code_r0x00110ce8:
  lVar25 = lVar25 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_00110cd0;
code_r0x00110e94:
  uVar20 = uVar20 + 8;
  goto LAB_00110e79;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}